

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_Surface::IsCylinder(ON_Surface *this,ON_Cylinder *cylinder,double tolerance)

{
  double dVar1;
  undefined1 auVar2 [16];
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ON_Plane *pOVar12;
  ON_Circle *pOVar13;
  char cVar14;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  ON_Line line;
  ON_Arc arc;
  ON_3dPoint local_1a0;
  undefined1 local_188 [16];
  double local_178;
  undefined8 uStack_170;
  void *local_168;
  undefined4 local_160;
  uint local_15c;
  ON_Line local_158;
  ulong local_120;
  long local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ON_Cylinder *local_f8;
  long local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  ON_Circle local_c8;
  double local_40;
  double dStack_38;
  ON_Curve *pOVar7;
  
  bVar16 = 0;
  local_188._8_4_ = in_XMM0_Dc;
  local_188._0_8_ = tolerance;
  local_188._12_4_ = in_XMM0_Dd;
  bVar3 = ON_IsValid(tolerance);
  uVar18 = local_188._0_4_;
  uVar19 = local_188._4_4_;
  uVar20 = local_188._8_4_;
  uVar21 = local_188._12_4_;
  if (!bVar3) {
    uVar18 = 0;
    uVar19 = 0x3df00000;
    uVar20 = 0;
    uVar21 = 0;
  }
  uVar17 = -(ulong)(0.0 < local_188._0_8_);
  uVar11 = CONCAT44(uVar19,uVar18) & uVar17;
  uVar18 = (undefined4)uVar11;
  uVar19 = (undefined4)(uVar11 >> 0x20);
  uVar10 = CONCAT44(uVar21,uVar20) & local_188._8_8_;
  auVar22._0_8_ = ~uVar17 & 0x3df0000000000000;
  auVar22._8_8_ = 0;
  auVar2._8_4_ = (int)uVar10;
  auVar2._0_8_ = uVar11;
  auVar2._12_4_ = (int)(uVar10 >> 0x20);
  local_188 = auVar22 | auVar2;
  bVar3 = ON_Object::IsKindOf((ON_Object *)this,&ON_RevSurface::m_ON_RevSurface_class_rtti);
  if (bVar3) {
    bVar3 = ON_RevSurface::IsCylindrical((ON_RevSurface *)this,cylinder,(double)local_188._0_8_);
    return bVar3;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.plane.origin.y = (double)CONCAT44(uVar19,uVar18);
  dVar1 = ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar1,0),this,0);
  pOVar7 = (ON_Curve *)CONCAT44(extraout_var,iVar4);
  if (pOVar7 == (ON_Curve *)0x0) {
    return false;
  }
  pOVar12 = &ON_Plane::World_xy;
  pOVar13 = &local_c8;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pOVar13->plane).origin.x = (pOVar12->origin).x;
    pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar13 = (ON_Circle *)((long)pOVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  ON_Line::ON_Line(&local_158);
  uVar18 = local_188._0_4_;
  uVar19 = local_188._4_4_;
  local_178 = (double)(-(ulong)(2.3283064365386963e-10 < local_188._0_8_) & (ulong)local_188._0_8_);
  uStack_170 = 0;
  iVar4 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])(pOVar7,0,&local_c8);
  bVar16 = (byte)iVar4;
  if (bVar16 == 0) {
    iVar4 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                      (local_178._0_4_,pOVar7);
    if ((char)iVar4 == '\0') goto LAB_005a1c55;
    ON_Curve::PointAtStart(&local_1a0,pOVar7);
    local_158.from.z = local_1a0.z;
    local_158.from.x = local_1a0.x;
    local_158.from.y = local_1a0.y;
    ON_Curve::PointAtEnd(&local_1a0,pOVar7);
    local_158.to.z = local_1a0.z;
    local_158.to.x = local_1a0.x;
    local_158.to.y = local_1a0.y;
    bVar15 = 1;
  }
  else {
LAB_005a1c55:
    bVar15 = 0;
  }
  (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar7);
  if ((bVar16 | bVar15) == 1) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_1a0.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_1a0.y = (double)CONCAT44(uVar19,uVar18);
    dVar1 = ON_Interval::Mid((ON_Interval *)&local_1a0);
    iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar1,0),this,1);
    pOVar7 = (ON_Curve *)CONCAT44(extraout_var_00,iVar4);
    if (pOVar7 != (ON_Curve *)0x0) {
      if (bVar16 == 0) {
        iVar4 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                          (local_178._0_4_,pOVar7,0,&local_c8);
        cVar14 = (char)iVar4;
      }
      else {
        cVar14 = '\x01';
        if (bVar15 == 0) {
          iVar4 = (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                            (local_178._0_4_,pOVar7);
          if ((char)iVar4 == '\0') {
            bVar15 = 0;
            goto LAB_005a1d3d;
          }
          ON_Curve::PointAtStart(&local_1a0,pOVar7);
          local_158.from.z = local_1a0.z;
          local_158.from.x = local_1a0.x;
          local_158.from.y = local_1a0.y;
          ON_Curve::PointAtEnd(&local_1a0,pOVar7);
          local_158.to.z = local_1a0.z;
          local_158.to.x = local_1a0.x;
          local_158.to.y = local_1a0.y;
        }
        bVar15 = 1;
      }
LAB_005a1d3d:
      (*(pOVar7->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar7);
      bVar16 = 0;
      if (bVar15 != 0) {
        bVar3 = false;
        if (cVar14 == '\0') goto LAB_005a1e3c;
        local_178 = local_c8.radius;
        p.y = local_158.from.y;
        p.x = local_158.from.x;
        p.z = local_158.from.z;
        ON_Plane::ClosestPointTo(&local_1a0,&local_c8.plane,p);
        dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_c8,&local_1a0);
        if ((double)local_188._0_8_ <= local_178 * 7.450580596925e-09) {
          local_188._0_8_ = local_178 * 7.450580596925e-09;
        }
        if (ABS(local_c8.radius - dVar1) <= (double)local_188._0_8_) {
          p_00.y = local_158.to.y;
          p_00.x = local_158.to.x;
          p_00.z = local_158.to.z;
          ON_Plane::ClosestPointTo(&local_1a0,&local_c8.plane,p_00);
          dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_c8,&local_1a0);
          if (ABS(local_c8.radius - dVar1) <= (double)local_188._0_8_) {
            uVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
            uVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
            pvVar8 = onmalloc((long)(int)(uVar5 + uVar6 + 2) << 3);
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,pvVar8);
            local_118 = (long)(int)uVar5;
            local_f0 = local_118 * 8 + 8 + (long)pvVar8;
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
            local_168 = pvVar8;
            if ((int)uVar5 < 1) {
              uVar11 = 1;
            }
            else {
              local_120 = (ulong)uVar5;
              uVar10 = 0;
              uVar11 = 0;
              local_110 = (ulong)uVar6;
              local_100 = (ulong)uVar6;
              local_f8 = cylinder;
              do {
                uVar5 = (uint)(uVar10 != 0);
                local_160 = (undefined4)uVar11;
                local_108 = uVar10;
                do {
                  local_178 = ((double)(int)(4 - uVar5) *
                               *(double *)((long)local_168 + local_108 * 8) +
                              (double)(int)uVar5 * *(double *)((long)local_168 + local_108 * 8 + 8))
                              * 0.25;
                  local_15c = uVar5;
                  if (0 < (int)local_110) {
                    uVar10 = 0;
                    do {
                      uVar11 = uVar10;
                      uVar5 = (uint)(uVar11 != 0);
                      iVar4 = 4 - (uint)(uVar11 != 0);
                      do {
                        PointAt(&local_1a0,this,local_178,
                                ((double)iVar4 * *(double *)(local_f0 + uVar11 * 8) +
                                (double)(int)uVar5 * *(double *)(local_f0 + 8 + uVar11 * 8)) * 0.25)
                        ;
                        local_d8 = local_1a0.z;
                        local_e8 = local_1a0.x;
                        dStack_e0 = local_1a0.y;
                        p_01.y = local_1a0.y;
                        p_01.x = local_1a0.x;
                        p_01.z = local_1a0.z;
                        ON_Plane::ClosestPointTo(&local_1a0,&local_c8.plane,p_01);
                        dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_c8,&local_1a0);
                        if ((double)local_188._0_8_ < ABS(local_c8.radius - dVar1)) {
                          onfree(local_168);
                          bVar3 = false;
                          bVar16 = (byte)local_160;
                          goto LAB_005a1e3c;
                        }
                        uVar5 = uVar5 + 1;
                        iVar4 = iVar4 + -1;
                      } while (uVar5 != 5);
                      uVar10 = uVar11 + 1;
                      cylinder = local_f8;
                    } while (uVar11 + 1 != local_100);
                  }
                  uVar5 = local_15c + 1;
                } while (uVar5 != 5);
                uVar10 = local_108 + 1;
                uVar11 = CONCAT71((int7)(uVar11 >> 8),local_118 <= (long)uVar10);
              } while (uVar10 != local_120);
            }
            bVar16 = (byte)uVar11;
            onfree(local_168);
            if (cylinder == (ON_Cylinder *)0x0) {
              bVar3 = true;
            }
            else {
              ON_Cylinder::Create(cylinder,&local_c8);
              bVar3 = ON_Cylinder::IsValid(cylinder);
            }
            goto LAB_005a1e3c;
          }
        }
      }
    }
  }
  bVar16 = 0;
  bVar3 = false;
LAB_005a1e3c:
  ON_Line::~ON_Line(&local_158);
  ON_Plane::~ON_Plane(&local_c8.plane);
  return (bool)(bVar16 & bVar3);
}

Assistant:

bool ON_Surface::IsCylinder( ON_Cylinder* cylinder, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  bool rc = rs && rs->IsCylindrical(cylinder,tolerance);

  if ( !rc && !rs )
  {
    ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
    if ( !crv )
      return false;

    ON_Arc arc;
    ON_Line line;
    int bIsLine = 0;
    int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( !bIsArc )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc && !bIsLine )
      return false;

    crv = IsoCurve(1,Domain(0).Mid());
    if ( !crv )
      return false;
    if ( !bIsArc )
      bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    else if ( !bIsLine )
    {
      bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
      if ( bIsLine )
      {
        line.from = crv->PointAtStart();
        line.to = crv->PointAtEnd();
      }
    }
    delete crv;
    crv = 0;
    if ( !bIsArc || !bIsLine )
      return false;

    double tol = 0.5*ON_SQRT_EPSILON*(arc.radius);
    if ( tol < tolerance )
      tol = tolerance;
    double r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
    if ( fabs(arc.radius - r) > tol )
      return false;
    r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
    if ( fabs(arc.radius - r) > tol )
      return false;

    ON_3dPoint P;
    double u, v;
    int sc0 = SpanCount(0);
    int sc1 = SpanCount(1);
    double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
    double* t = s + (sc0+1);
    GetSpanVector(0,s);
    GetSpanVector(1,t);
    for ( int i = 0; i < sc0; i++ )
    {
      for ( int ii = i?1:0; ii <= 4; ii++ )
      {
        u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
        for ( int j = 0; j < sc1; j++ )
        {
          for ( int jj = j?1:0; jj <= 4; jj++ )
          {
            v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
            P = PointAt(u,v);
            r = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(P));
            if ( fabs(arc.radius - r) > tol )
            {
              onfree(s);
              return false;
            }
          }
        }
      }
    }
    onfree(s);


    rc = true;
    if ( cylinder )
    {
      cylinder->Create(arc);
      rc = cylinder->IsValid();
    }
  }

  return rc;
}